

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_table.c
# Opt level: O0

uint64_t llmsset_lookup2(llmsset_t dbs,uint64_t a,uint64_t b,int *created,int custom)

{
  ulong *puVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  uint64_t *puVar6;
  bool bVar7;
  uint64_t *d_ptr_1;
  uint64_t d_idx;
  uint64_t *d_ptr;
  ulong local_80;
  uint64_t v;
  uint64_t *bucket;
  uint64_t uStack_68;
  int i;
  uint64_t cidx;
  uint64_t last;
  uint64_t idx;
  uint64_t hash;
  uint64_t step;
  uint64_t hash_rehash;
  int custom_local;
  int *created_local;
  uint64_t b_local;
  uint64_t a_local;
  llmsset_t dbs_local;
  
  created_local = (int *)b;
  b_local = a;
  a_local = (uint64_t)dbs;
  if (custom == 0) {
    step = sylvan_tabhash16(a,b,0xcbf29ce484222325);
  }
  else {
    step = (*dbs->hash_cb)(a,b,0xcbf29ce484222325);
  }
  uVar4 = step >> 0x14;
  uVar5 = step & 0xffffff0000000000;
  uStack_68 = 0;
  bucket._4_4_ = 0;
  cidx = step & *(ulong *)(a_local + 0x38);
  last = cidx;
  do {
    puVar1 = (ulong *)(*(long *)a_local + last * 8);
    uVar2 = *puVar1;
    local_80 = uVar2;
    if (uVar2 == 0) {
      if (uStack_68 == 0) {
        uStack_68 = claim_data_bucket((llmsset_t)a_local);
        if (uStack_68 == 0xffffffffffffffff) {
          return 0;
        }
        if (custom != 0) {
          (**(code **)(a_local + 0x58))(&b_local,&created_local);
        }
        puVar6 = (uint64_t *)(*(long *)(a_local + 8) + uStack_68 * 0x10);
        *puVar6 = b_local;
        puVar6[1] = (uint64_t)created_local;
      }
      LOCK();
      local_80 = *puVar1;
      bVar7 = local_80 == 0;
      if (bVar7) {
        *puVar1 = uVar5 | uStack_68;
        local_80 = uVar2;
      }
      UNLOCK();
      if (bVar7) {
        if (custom != 0) {
          set_custom_bucket((llmsset_t)a_local,uStack_68,custom);
        }
        *created = 1;
        return uStack_68;
      }
    }
    if (uVar5 == (local_80 & 0xffffff0000000000)) {
      local_80 = local_80 & 0xffffffffff;
      puVar6 = (uint64_t *)(*(long *)(a_local + 8) + local_80 * 0x10);
      if (custom == 0) {
        if ((*puVar6 == b_local) && ((int *)puVar6[1] == created_local)) {
          if (uStack_68 != 0) {
            release_data_bucket((llmsset_t)a_local,uStack_68);
          }
          *created = 0;
          return local_80;
        }
      }
      else {
        iVar3 = (**(code **)(a_local + 0x50))(b_local,created_local,*puVar6,puVar6[1]);
        if (iVar3 != 0) {
          if (uStack_68 != 0) {
            (**(code **)(a_local + 0x60))(b_local,created_local);
            release_data_bucket((llmsset_t)a_local,uStack_68);
          }
          *created = 0;
          return local_80;
        }
      }
    }
    sylvan_stats_count(0xc1);
    last = last & 0xfffffffffffffff8 | last + 1 & 7;
    if (last == cidx) {
      bucket._4_4_ = bucket._4_4_ + 1;
      if (bucket._4_4_ == *(short *)(a_local + 0x68)) {
        return 0;
      }
      step = (uVar4 | 1) * 8 + step;
      cidx = step & *(ulong *)(a_local + 0x38);
      last = cidx;
    }
  } while( true );
}

Assistant:

static inline uint64_t
llmsset_lookup2(const llmsset_t dbs, uint64_t a, uint64_t b, int* created, const int custom)
{
    uint64_t hash_rehash = 14695981039346656037LLU;
    if (custom) hash_rehash = dbs->hash_cb(a, b, hash_rehash);
    else hash_rehash = sylvan_tabhash16(a, b, hash_rehash);

    const uint64_t step = (((hash_rehash >> 20) | 1) << 3);
    const uint64_t hash = hash_rehash & MASK_HASH;
    uint64_t idx, last, cidx = 0;
    int i=0;

#if LLMSSET_MASK
    last = idx = hash_rehash & dbs->mask;
#else
    last = idx = hash_rehash % dbs->table_size;
#endif

    for (;;) {
        _Atomic(uint64_t)* bucket = dbs->table + idx;
        uint64_t v = atomic_load_explicit(bucket, memory_order_acquire);

        if (v == 0) {
            if (cidx == 0) {
                // Claim data bucket and write data
                cidx = claim_data_bucket(dbs);
                if (cidx == (uint64_t)-1) return 0; // failed to claim a data bucket
                if (custom) dbs->create_cb(&a, &b);
                uint64_t *d_ptr = ((uint64_t*)dbs->data) + 2*cidx;
                d_ptr[0] = a;
                d_ptr[1] = b;
            }
            if (atomic_compare_exchange_strong(bucket, &v, hash | cidx)) {
                if (custom) set_custom_bucket(dbs, cidx, custom);
                *created = 1;
                return cidx;
            }
        }

        if (hash == (v & MASK_HASH)) {
            uint64_t d_idx = v & MASK_INDEX;
            uint64_t *d_ptr = ((uint64_t*)dbs->data) + 2*d_idx;
            if (custom) {
                if (dbs->equals_cb(a, b, d_ptr[0], d_ptr[1])) {
                    if (cidx != 0) {
                        dbs->destroy_cb(a, b);
                        release_data_bucket(dbs, cidx);
                    }
                    *created = 0;
                    return d_idx;
                }
            } else {
                if (d_ptr[0] == a && d_ptr[1] == b) {
                    if (cidx != 0) release_data_bucket(dbs, cidx);
                    *created = 0;
                    return d_idx;
                }
            }
        }

        sylvan_stats_count(LLMSSET_LOOKUP);

        // find next idx on probe sequence
        idx = (idx & CL_MASK) | ((idx+1) & CL_MASK_R);
        if (idx == last) {
            if (++i == dbs->threshold) return 0; // failed to find empty spot in probe sequence

            // go to next cache line in probe sequence
            hash_rehash += step;

#if LLMSSET_MASK
            last = idx = hash_rehash & dbs->mask;
#else
            last = idx = hash_rehash % dbs->table_size;
#endif
        }
    }
}